

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O0

void IOcontroller::write_order_seeds
               (string *outFileName,TResult *resultObj,string *outFolder,Graph *graph)

{
  char *pcVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  const_reference this;
  int local_2b4;
  undefined1 local_2b0 [4];
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  ostream local_270 [8];
  ofstream outFile;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> outpath;
  Nodelist vecSeed;
  Graph *graph_local;
  string *outFolder_local;
  TResult *resultObj_local;
  string *outFileName_local;
  
  ResultInfo::get_seed_vec((Nodelist *)((long)&outpath.field_2 + 8),resultObj);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  mkdir_absence(pcVar1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 outFolder,"/seed");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  mkdir_absence(pcVar1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 "/seed_");
  std::operator+(&local_290,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                 outFileName);
  std::ofstream::ofstream(local_270,(string *)&local_290,_S_out);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)local_2b0);
  local_2b4 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       ((long)&outpath.field_2 + 8));
    if (sVar2 <= (ulong)(long)local_2b4) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        ((long)&outpath.field_2 + 8),(long)local_2b4);
    poVar4 = (ostream *)std::ostream::operator<<(local_270,*pvVar3);
    poVar4 = std::operator<<(poVar4," ");
    this = std::
           vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
           ::operator[](graph,(long)local_2b4);
    sVar2 = std::
            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ::size(this);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar2);
    std::operator<<(poVar4,'\n');
    local_2b4 = local_2b4 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_270);
  std::__cxx11::string::~string((string *)local_60);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&outpath.field_2 + 8));
  return;
}

Assistant:

static void write_order_seeds(const std::string& outFileName, const TResult& resultObj,
            const std::string& outFolder, const Graph & graph)
    {
        auto vecSeed = resultObj.get_seed_vec();
        mkdir_absence(outFolder.c_str());
        const auto outpath = outFolder + "/seed";
        mkdir_absence(outpath.c_str());
        std::ofstream outFile(outpath + "/seed_" + outFileName);
        for (auto i = 0; i < vecSeed.size(); i++)
        {
            outFile << vecSeed[i] << " " << graph[i].size() << '\n';
        }
        outFile.close();
    }